

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O1

void __thiscall
cfd::core::Address::Address
          (Address *this,NetType_conflict type,WitnessVersion witness_ver,TaprootScriptTree *tree,
          SchnorrPubkey *internal_pubkey,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *network_parameters)

{
  AddressFormatData *__return_storage_ptr__;
  NetType_conflict NVar1;
  string local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  SchnorrPubkey *local_78;
  Script *local_70;
  TaprootScriptTree *local_68;
  Pubkey *local_60;
  ByteData *local_58;
  string *local_50;
  CfdSourceLocation local_48;
  
  this->type_ = type;
  this->addr_type_ = kTaprootAddress;
  this->witness_ver_ = witness_ver;
  local_80 = &(this->address_).field_2;
  (this->address_)._M_dataplus._M_p = (pointer)local_80;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&this->address_,"");
  local_58 = &this->hash_;
  local_50 = &this->address_;
  ByteData::ByteData(local_58);
  local_60 = &this->pubkey_;
  Pubkey::Pubkey(local_60);
  local_78 = &this->schnorr_pubkey_;
  SchnorrPubkey::SchnorrPubkey(local_78);
  local_68 = &this->script_tree_;
  TaprootScriptTree::TaprootScriptTree(local_68,tree);
  local_70 = &this->redeem_script_;
  Script::Script(local_70);
  __return_storage_ptr__ = &this->format_data_;
  GetTargetFormatData(__return_storage_ptr__,network_parameters,type);
  this->checksum_[0] = '\0';
  this->checksum_[1] = '\0';
  this->checksum_[2] = '\0';
  this->checksum_[3] = '\0';
  NVar1 = AddressFormatData::GetNetType(__return_storage_ptr__);
  this->type_ = NVar1;
  TapBranch::GetTweakedPubkey
            ((SchnorrPubkey *)&local_a0,&tree->super_TapBranch,internal_pubkey,(bool *)0x0);
  ByteData256::operator=(&local_78->data_,(ByteData256 *)&local_a0);
  if (local_a0._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_a0._M_dataplus._M_p,
                    local_a0.field_2._M_allocated_capacity - (long)local_a0._M_dataplus._M_p);
  }
  AddressFormatData::GetBech32Hrp_abi_cxx11_(&local_a0,__return_storage_ptr__);
  CalculateTaproot(this,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_48.filename = "cfdcore_address.cpp";
  local_48.line = 0x330;
  local_48.funcname = "Address";
  AddressFormatData::GetBech32Hrp_abi_cxx11_(&local_a0,__return_storage_ptr__);
  logger::log<cfd::core::NetType&,cfd::core::AddressType&,std::__cxx11::string&>
            (&local_48,kCfdLogLevelInfo,"call Address({},{},{})",&this->type_,&this->addr_type_,
             &local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

Address::Address(
    NetType type, WitnessVersion witness_ver, const TaprootScriptTree& tree,
    const SchnorrPubkey& internal_pubkey,
    const std::vector<AddressFormatData>& network_parameters)
    : type_(type),
      addr_type_(AddressType::kTaprootAddress),
      witness_ver_(witness_ver),
      address_(""),
      hash_(),
      pubkey_(),
      schnorr_pubkey_(),
      script_tree_(tree),
      redeem_script_(),
      format_data_(GetTargetFormatData(network_parameters, type)) {
  memset(checksum_, 0, sizeof(checksum_));
  SetNetType(format_data_);
  schnorr_pubkey_ = tree.GetTweakedPubkey(internal_pubkey);
  CalculateTaproot(format_data_.GetBech32Hrp());
  info(
      CFD_LOG_SOURCE, "call Address({},{},{})", type_, addr_type_,
      format_data_.GetBech32Hrp());
}